

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O0

void __thiscall
amrex::MLEBTensorOp::MLEBTensorOp
          (MLEBTensorOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
          *a_factory)

{
  undefined8 *in_RDI;
  Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  *in_stack_00000240;
  LPInfo *in_stack_00000248;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *in_stack_00000250
  ;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_00000258;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_00000260;
  MLEBTensorOp *in_stack_00000268;
  MLEBABecLap *in_stack_ffffffffffffffa0;
  undefined8 *b;
  undefined8 *a;
  MLEBABecLap *this_00;
  
  MLEBABecLap::MLEBABecLap(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__MLEBTensorOp_01805158;
  *(undefined1 *)((long)in_RDI + 0x3d4) = 1;
  *(undefined1 *)((long)in_RDI + 0x3d5) = 0;
  *(undefined1 *)((long)in_RDI + 0x3d6) = 0;
  b = in_RDI + 0x7b;
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)0x157f756);
  a = in_RDI + 0x7e;
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            *)0x157f76c);
  this_00 = (MLEBABecLap *)(in_RDI + 0x81);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)0x157f782);
  MLEBABecLap::setScalars(this_00,(Real)a,(Real)b);
  define(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
         in_stack_00000240);
  return;
}

Assistant:

MLEBTensorOp::MLEBTensorOp (const Vector<Geometry>& a_geom,
                            const Vector<BoxArray>& a_grids,
                            const Vector<DistributionMapping>& a_dmap,
                            const LPInfo& a_info,
                            const Vector<EBFArrayBoxFactory const*>& a_factory)
{
    MLEBABecLap::setScalars(1.0,1.0);
    define(a_geom, a_grids, a_dmap, a_info, a_factory);
}